

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

Char * Diligent::GetBlendOperationLiteralName(BLEND_OPERATION BlendOp)

{
  Char *pCVar1;
  char (*in_R8) [2];
  string msg;
  int local_2c;
  string local_28;
  
  if (BlendOp < BLEND_OPERATION_NUM_OPERATIONS) {
    pCVar1 = &DAT_0075deb4 + *(int *)(&DAT_0075deb4 + (ulong)BlendOp * 4);
  }
  else {
    local_2c = (int)(char)BlendOp;
    FormatString<char[29],int,char[2]>
              (&local_28,(Diligent *)"Unexpected blend operation (",(char (*) [29])&local_2c,
               (int *)0x73bf31,in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetBlendOperationLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x403);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    pCVar1 = "UNKNOWN";
  }
  return pCVar1;
}

Assistant:

const Char* GetBlendOperationLiteralName(BLEND_OPERATION BlendOp)
{
#define BLEND_OP_TO_STR(BlendOp) \
    case BlendOp: return #BlendOp

    static_assert(BLEND_OPERATION_NUM_OPERATIONS == 6, "Please update the switch below to handle the new blend op");
    switch (BlendOp)
    {
        BLEND_OP_TO_STR(BLEND_OPERATION_UNDEFINED);
        BLEND_OP_TO_STR(BLEND_OPERATION_ADD);
        BLEND_OP_TO_STR(BLEND_OPERATION_SUBTRACT);
        BLEND_OP_TO_STR(BLEND_OPERATION_REV_SUBTRACT);
        BLEND_OP_TO_STR(BLEND_OPERATION_MIN);
        BLEND_OP_TO_STR(BLEND_OPERATION_MAX);

        default:
            UNEXPECTED("Unexpected blend operation (", static_cast<int>(BlendOp), ")");
            return "UNKNOWN";
    }
#undef BLEND_OP_TO_STR
}